

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O0

int pub_decode_gost_ec(EVP_PKEY *pk,X509_PUBKEY *pub)

{
  int iVar1;
  EC_KEY *pEVar2;
  EC_GROUP *group_00;
  X509_PUBKEY *in_RSI;
  EVP_PKEY *in_RDI;
  int retval;
  EC_GROUP *group;
  size_t len;
  ASN1_OCTET_STRING *octet;
  BIGNUM *Y;
  BIGNUM *X;
  EC_POINT *pub_key;
  int pub_len;
  ASN1_OBJECT *palgobj;
  uchar *databuf;
  uchar *pubkey_buf;
  X509_ALGOR *palg;
  EVP_PKEY *pkey;
  int in_stack_ffffffffffffff90;
  int function;
  ASN1_OCTET_STRING *local_58;
  BIGNUM *a;
  BIGNUM *a_00;
  EC_POINT *local_40;
  int local_34;
  ASN1_OBJECT *local_30;
  uchar *local_28;
  uchar *local_20;
  X509_ALGOR *local_18 [2];
  EVP_PKEY *local_8;
  
  local_18[0] = (X509_ALGOR *)0x0;
  local_20 = (uchar *)0x0;
  local_28 = (uchar *)0x0;
  local_30 = (ASN1_OBJECT *)0x0;
  local_40 = (EC_POINT *)0x0;
  a_00 = (BIGNUM *)0x0;
  a = (BIGNUM *)0x0;
  local_58 = (ASN1_OCTET_STRING *)0x0;
  function = 0;
  local_8 = in_RDI;
  iVar1 = X509_PUBKEY_get0_param(&local_30,&local_20,&local_34,local_18,in_RSI);
  if (iVar1 != 0) {
    pkey = local_8;
    iVar1 = OBJ_obj2nid(local_30);
    EVP_PKEY_assign(pkey,iVar1,(void *)0x0);
    iVar1 = decode_gost_algor_params((EVP_PKEY *)a_00,(X509_ALGOR *)a);
    if (iVar1 != 0) {
      pEVar2 = (EC_KEY *)EVP_PKEY_get0(local_8);
      group_00 = EC_KEY_get0_group(pEVar2);
      local_58 = d2i_ASN1_OCTET_STRING((ASN1_OCTET_STRING **)0x0,&local_20,(long)local_34);
      if (local_58 == (ASN1_OCTET_STRING *)0x0) {
        ERR_GOST_error(function,in_stack_ffffffffffffff90,(char *)pkey,0);
      }
      else {
        local_28 = (uchar *)CRYPTO_malloc(local_58->length,
                                          "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ameth.c"
                                          ,0x3a2);
        if (local_28 == (uchar *)0x0) {
          ERR_GOST_error(function,in_stack_ffffffffffffff90,(char *)pkey,0);
        }
        else {
          BUF_reverse(local_28,local_58->data,(long)local_58->length);
          iVar1 = local_58->length / 2;
          a = BN_bin2bn(local_28,iVar1,(BIGNUM *)0x0);
          a_00 = BN_bin2bn(local_28 + iVar1,iVar1,(BIGNUM *)0x0);
          if ((a_00 == (BIGNUM *)0x0) || (a == (BIGNUM *)0x0)) {
            ERR_GOST_error(function,in_stack_ffffffffffffff90,(char *)pkey,0);
          }
          else {
            local_40 = EC_POINT_new(group_00);
            iVar1 = EC_POINT_set_affine_coordinates(group_00,local_40,a_00,a,0);
            if (iVar1 == 0) {
              ERR_GOST_error(function,in_stack_ffffffffffffff90,(char *)pkey,0);
            }
            else {
              pEVar2 = (EC_KEY *)EVP_PKEY_get0(local_8);
              function = EC_KEY_set_public_key(pEVar2,local_40);
              if (function == 0) {
                ERR_GOST_error(0,in_stack_ffffffffffffff90,(char *)pkey,0);
              }
            }
          }
        }
      }
    }
  }
  EC_POINT_free(local_40);
  BN_free(a_00);
  BN_free(a);
  CRYPTO_free(local_28);
  ASN1_OCTET_STRING_free(local_58);
  return function;
}

Assistant:

static int pub_decode_gost_ec(EVP_PKEY *pk, const X509_PUBKEY *pub)
{
    X509_ALGOR *palg = NULL;
    const unsigned char *pubkey_buf = NULL;
    unsigned char *databuf = NULL;
    ASN1_OBJECT *palgobj = NULL;
    int pub_len;
    EC_POINT *pub_key = NULL;
    BIGNUM *X = NULL, *Y = NULL;
    ASN1_OCTET_STRING *octet = NULL;
    size_t len;
    const EC_GROUP *group;
    int retval = 0;

    if (!X509_PUBKEY_get0_param(&palgobj, &pubkey_buf, &pub_len, &palg, pub))
        goto ret;
    EVP_PKEY_assign(pk, OBJ_obj2nid(palgobj), NULL);
    if (!decode_gost_algor_params(pk, palg))
        goto ret;
    group = EC_KEY_get0_group(EVP_PKEY_get0(pk));
    octet = d2i_ASN1_OCTET_STRING(NULL, &pubkey_buf, pub_len);
    if (!octet) {
        GOSTerr(GOST_F_PUB_DECODE_GOST_EC, ERR_R_MALLOC_FAILURE);
        goto ret;
    }
    databuf = OPENSSL_malloc(octet->length);
    if (!databuf) {
        GOSTerr(GOST_F_PUB_DECODE_GOST_EC, ERR_R_MALLOC_FAILURE);
        goto ret;
    }

    BUF_reverse(databuf, octet->data, octet->length);
    len = octet->length / 2;

    Y = BN_bin2bn(databuf, len, NULL);
    X = BN_bin2bn(databuf + len, len, NULL);
    if (!X || !Y) {
        GOSTerr(GOST_F_PUB_DECODE_GOST_EC, ERR_R_BN_LIB);
        goto ret;
    }
    pub_key = EC_POINT_new(group);
    if (!EC_POINT_set_affine_coordinates(group, pub_key, X, Y, NULL)) {
        GOSTerr(GOST_F_PUB_DECODE_GOST_EC, ERR_R_EC_LIB);
        goto ret;
    }

    retval = EC_KEY_set_public_key(EVP_PKEY_get0(pk), pub_key);
    if (!retval)
        GOSTerr(GOST_F_PUB_DECODE_GOST_EC, ERR_R_EC_LIB);

ret:
    EC_POINT_free(pub_key);
    BN_free(X);
    BN_free(Y);
    OPENSSL_free(databuf);
    ASN1_OCTET_STRING_free(octet);
    return retval;
}